

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptOutputPrimitiveGeometry(HlslGrammar *this,TLayoutGeometry *geometry)

{
  EHlslTokenClass EVar1;
  EHlslTokenClass geometryType;
  TLayoutGeometry *geometry_local;
  HlslGrammar *this_local;
  
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (EVar1 == EHTokPointStream) {
    *geometry = ElgPoints;
  }
  else if (EVar1 == EHTokLineStream) {
    *geometry = ElgLineStrip;
  }
  else {
    if (EVar1 != EHTokTriangleStream) {
      return false;
    }
    *geometry = ElgTriangleStrip;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  return true;
}

Assistant:

bool HlslGrammar::acceptOutputPrimitiveGeometry(TLayoutGeometry& geometry)
{
    // read geometry type
    const EHlslTokenClass geometryType = peek();

    switch (geometryType) {
    case EHTokPointStream:    geometry = ElgPoints;        break;
    case EHTokLineStream:     geometry = ElgLineStrip;     break;
    case EHTokTriangleStream: geometry = ElgTriangleStrip; break;
    default:
        return false;  // not a layout geometry
    }

    advanceToken();  // consume the layout keyword
    return true;
}